

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1L1Q1P<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,
          Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *Pi,
          Matrix<float,_4,_1,_0,_4,_1> *Pi_B)

{
  iterator iVar1;
  Index index;
  long lVar2;
  undefined4 *puVar3;
  float *pfVar4;
  _Nested n;
  SrcXprType *src;
  Scalar SVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  RealScalar z_1;
  float fVar10;
  float fVar11;
  RealScalar z;
  float fVar12;
  Matrix<float,_3,_1,_0,_3,_1> v3;
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi_B;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi;
  Matrix<float,_4,_1,_0,_4,_1> Pi_B1;
  Matrix<float,_4,_1,_0,_4,_1> Pi_1;
  Matrix<float,_3,_1,_0,_3,_1> local_258;
  Matrix<float,_3,_1,_0,_3,_1> local_24c;
  Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_240;
  Matrix<float,_4,_4,_0,_4,_4> local_238;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [4];
  float fStack_1b4;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  variable_if_dynamic<long,__1> local_178;
  float *local_170;
  Matrix<float,_4,_1,_0,_4,_1> *local_168;
  variable_if_dynamic<long,__1> local_160;
  Index local_150;
  float local_138 [16];
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8 [4];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float afStack_78 [7];
  undefined4 local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uStack_1b0 = 3;
  local_198 = 0;
  local_188 = 4;
  local_178.m_value = 3;
  local_160.m_value = 0;
  local_150 = 4;
  _local_1b8 = P1;
  uStack_1a0 = P1;
  uStack_180 = Pi;
  local_168 = Pi;
  uStack_f0 = P1;
  uStack_e0 = Pi;
  SVar5 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                      *)local_f8,(scalar_sum_op<float,_float> *)local_138,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                      *)local_1b8);
  fVar6 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  lVar2 = 0;
  do {
    afStack_78[lVar2 + 4] =
         (P1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [lVar2] - (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                   m_data.array[lVar2] * (SVar5 + fVar6);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_5c = 0x3f800000;
  uStack_1b0 = 3;
  local_198 = 0;
  local_188 = 4;
  local_178.m_value = 3;
  local_160.m_value = 0;
  local_150 = 4;
  _local_1b8 = P1_B;
  uStack_1a0 = P1_B;
  uStack_180 = Pi_B;
  local_168 = Pi_B;
  uStack_f0 = P1_B;
  uStack_e0 = Pi_B;
  SVar5 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                      *)local_f8,(scalar_sum_op<float,_float> *)local_138,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                      *)local_1b8);
  fVar6 = (Pi_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  lVar2 = 0;
  do {
    afStack_78[lVar2] =
         (P1_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [lVar2] - (Pi_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                   m_data.array[lVar2] * (SVar5 + fVar6);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_78[3] = 1.0;
  puVar3 = (undefined4 *)local_f8;
  local_f8 = (undefined1  [8])0x0;
  uStack_f0 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_e8 = 0;
  uStack_e0 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  lVar2 = 0;
  do {
    *puVar3 = 0x3f800000;
    lVar2 = lVar2 + 0x10;
    puVar3 = puVar3 + 5;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    local_c8[lVar2] = -afStack_78[lVar2 + 4];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pfVar4 = local_138;
  local_138[0xc] = 0.0;
  local_138[0xd] = 0.0;
  local_138[0xe] = 0.0;
  local_138[0xf] = 0.0;
  local_138[8] = 0.0;
  local_138[9] = 0.0;
  local_138[10] = 0.0;
  local_138[0xb] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar2 = 0;
  do {
    *pfVar4 = 1.0;
    lVar2 = lVar2 + 0x10;
    pfVar4 = pfVar4 + 5;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    local_138[lVar2 + 0xc] = -afStack_78[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8 = (non_const_type)local_f8;
  pfVar4 = (float *)local_1b8;
  uStack_b0 = Pi;
  Eigen::internal::
  Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<float,_4,_4,_1,_4,_4> *)pfVar4,(SrcXprType *)&local_b8,
        (assign_op<float,_float> *)local_1f8);
  local_178.m_value = (long)uStack_b0;
  local_168 = uStack_b0;
  local_160.m_value = 4;
  if (((ulong)uStack_b0 & 0xf) == 0) {
    fVar6 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
            m_data.array[0];
    fVar7 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
            m_data.array[1];
    fVar8 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
            m_data.array[2];
    fVar9 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
            m_data.array[3];
    local_48 = uStack_1b0._4_4_ * fVar9 + fStack_1b4 * fVar7 +
               (float)uStack_1b0 * fVar8 + (float)local_1b8 * fVar6;
    fStack_44 = uStack_1a0._4_4_ * fVar9 + local_1a8._4_4_ * fVar7 +
                (float)uStack_1a0 * fVar8 + (float)local_1a8 * fVar6;
    fStack_40 = uStack_190._4_4_ * fVar9 + local_198._4_4_ * fVar7 +
                (float)uStack_190 * fVar8 + (float)local_198 * fVar6;
    fStack_3c = fVar9 * uStack_180._4_4_ + fVar7 * local_188._4_4_ +
                fVar8 * (float)uStack_180 + fVar6 * (float)local_188;
    local_b8 = (non_const_type)local_138;
    src = (SrcXprType *)&local_b8;
    local_170 = pfVar4;
    uStack_b0 = Pi_B;
    Eigen::internal::
    Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<float,_4,_4,_1,_4,_4> *)pfVar4,src,(assign_op<float,_float> *)local_1f8);
    local_178.m_value = (long)uStack_b0;
    local_168 = uStack_b0;
    local_160.m_value = 4;
    if (((ulong)uStack_b0 & 0xf) == 0) {
      fVar6 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
              m_data.array[0];
      fVar7 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
              m_data.array[1];
      fVar8 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
              m_data.array[2];
      fVar9 = (uStack_b0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
              m_data.array[3];
      local_58 = uStack_1b0._4_4_ * fVar9 + fStack_1b4 * fVar7 +
                 (float)uStack_1b0 * fVar8 + (float)local_1b8 * fVar6;
      fStack_54 = uStack_1a0._4_4_ * fVar9 + local_1a8._4_4_ * fVar7 +
                  (float)uStack_1a0 * fVar8 + (float)local_1a8 * fVar6;
      fStack_50 = uStack_190._4_4_ * fVar9 + local_198._4_4_ * fVar7 +
                  (float)uStack_190 * fVar8 + (float)local_198 * fVar6;
      fStack_4c = fVar9 * uStack_180._4_4_ + fVar7 * local_188._4_4_ +
                  fVar8 * (float)uStack_180 + fVar6 * (float)local_188;
      _local_1b8 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
      uStack_1b0 = 0;
      local_1a8 = 0;
      uStack_1a0 = (XprTypeNested)0x0;
      local_198 = 0;
      uStack_190 = 0;
      local_188 = 0;
      uStack_180 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
      lVar2 = 0;
      local_170 = pfVar4;
      do {
        *pfVar4 = 1.0;
        lVar2 = lVar2 + 0x10;
        pfVar4 = pfVar4 + 5;
      } while (lVar2 != 0x40);
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (non_const_type)0x0;
      uStack_b0 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
      lVar2 = 0;
      do {
        *(undefined4 *)&(src->m_xpr).m_matrix = 0x3f800000;
        lVar2 = lVar2 + 0x10;
        src = (SrcXprType *)((long)&src[2].m_xpr.m_matrix + 4);
      } while (lVar2 != 0x40);
      local_1f8 = (undefined1  [8])&local_48;
      uStack_1f0 = 3;
      local_1d8 = 0;
      local_1c8 = 4;
      uStack_1e0 = (float *)local_1f8;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
      normalized((PlainObject *)&local_238,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                 local_1f8);
      if (CONCAT44(local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5],
                   local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4]) == 3) {
        local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1];
        local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2];
        fVar6 = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2] * 0.0 +
                local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] * -0.0;
        local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] * 0.0 -
              local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0] * 0.0;
        fVar8 = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] -
                local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2];
        fVar7 = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] -
                local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0];
        local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] * -0.0 +
              local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2];
        local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2] * -0.0 +
              local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        fVar10 = fVar7 * fVar7 + fVar8 * fVar8 + fVar6 * fVar6;
        fVar9 = SQRT(fVar10);
        fVar12 = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] *
                 local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] +
                 local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] *
                 local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] +
                 local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] *
                 local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
        fVar11 = SQRT(fVar12);
        if (fVar11 <= fVar9) {
          local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = fVar6;
          local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = fVar7;
          local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = fVar8;
          if (0.0 < fVar10) {
            local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = fVar6 / fVar9;
            local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = fVar8 / fVar9;
            local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = fVar7 / fVar9;
          }
        }
        else if (0.0 < fVar12) {
          local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] / fVar11;
          local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] / fVar11;
          local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] / fVar11;
        }
        uStack_1f0 = 1;
        local_1e8 = 3;
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_1c8 = 4;
        local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        ._0_8_ = &local_258;
        local_1f8 = (undefined1  [8])local_1b8;
        uStack_1e0 = (float *)local_1b8;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                  ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                   (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_238);
        if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
          lVar2 = 0;
          do {
            *(float *)local_1f8 =
                 (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array._0_8_)->m_storage).m_data.array[lVar2];
            lVar2 = lVar2 + 1;
            local_1f8 = (undefined1  [8])((long)local_1f8 + 0x10);
          } while (lVar2 != 3);
          local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] = local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] *
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] -
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] *
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1];
          local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] = local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] -
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0];
          local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] *
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] -
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] *
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
          local_1f8 = (undefined1  [8])(local_1b8 + 4);
          uStack_1f0 = 1;
          local_1e8 = 3;
          local_1d8 = 1;
          uStack_1d0 = 0;
          local_1c8 = 4;
          local_240.m_matrix = (non_const_type)&local_238;
          uStack_1e0 = (float *)local_1b8;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                    ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                     &local_240);
          if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
            lVar2 = 0;
            do {
              *(float *)local_1f8 =
                   *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                     &(local_240.m_matrix)->
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)->
                                    m_storage).m_data.array + lVar2 * 4);
              lVar2 = lVar2 + 1;
              local_1f8 = (undefined1  [8])((long)local_1f8 + 0x10);
            } while (lVar2 != 3);
            local_1f8 = (undefined1  [8])&uStack_1b0;
            uStack_1f0 = 1;
            local_1e8 = 3;
            local_1d8 = 2;
            uStack_1d0 = 0;
            local_1c8 = 4;
            local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array._0_8_ = &local_24c;
            uStack_1e0 = (float *)local_1b8;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                      ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                       (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_238);
            if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
              lVar2 = 0;
              do {
                *(float *)local_1f8 =
                     (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                      local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array._0_8_)->m_storage).m_data.array[lVar2];
                lVar2 = lVar2 + 1;
                local_1f8 = (undefined1  [8])((long)local_1f8 + 0x10);
              } while (lVar2 != 3);
              local_1f8 = (undefined1  [8])(afStack_78 + 8);
              uStack_1f0 = 3;
              local_1d8 = 0;
              local_1c8 = 4;
              uStack_1e0 = (float *)local_1f8;
              Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
              normalized((PlainObject *)&local_238,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                          *)local_1f8);
              if (CONCAT44(local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                           m_storage.m_data.array[5],
                           local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                           m_storage.m_data.array[4]) != 3) goto LAB_0014f580;
              local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0];
              local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1];
              local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2];
              fVar6 = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2] * 0.0 +
                      local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1] * -0.0;
              local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1] * 0.0 -
                          local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0];
              local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0] * 0.0;
              fVar8 = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0] -
                      local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
              fVar7 = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1] -
                      local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0];
              local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1] * -0.0 +
                          local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2];
              local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] = local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2] * -0.0 +
                          local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0];
              fVar10 = fVar7 * fVar7 + fVar8 * fVar8 + fVar6 * fVar6;
              fVar9 = SQRT(fVar10);
              fVar12 = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] *
                       local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] +
                       local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] *
                       local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] +
                       local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0] *
                       local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
              fVar11 = SQRT(fVar12);
              if (fVar11 <= fVar9) {
                local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] = fVar6;
                local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] = fVar7;
                local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] = fVar8;
                if (0.0 < fVar10) {
                  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] = fVar6 / fVar9;
                  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] = fVar8 / fVar9;
                  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] = fVar7 / fVar9;
                }
              }
              else if (0.0 < fVar12) {
                local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] =
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] / fVar11;
                local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] =
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] / fVar11;
                local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] / fVar11;
              }
              uStack_1f0 = 1;
              local_1e8 = 3;
              local_1d8 = 0;
              uStack_1d0 = 0;
              local_1c8 = 4;
              local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array._0_8_ = &local_258;
              local_1f8 = (undefined1  [8])&local_b8;
              uStack_1e0 = (float *)&local_b8;
              Eigen::internal::
              check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                        ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                         (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_238);
              if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
                lVar2 = 0;
                do {
                  *(float *)local_1f8 =
                       (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                        local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array._0_8_)->m_storage).m_data.array[lVar2];
                  lVar2 = lVar2 + 1;
                  local_1f8 = (undefined1  [8])((long)local_1f8 + 0x10);
                } while (lVar2 != 3);
                local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2] =
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] *
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] -
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] *
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1];
                local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] =
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] -
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0];
                local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] =
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] *
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] -
                     local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] *
                     local_24c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
                local_1f8 = (undefined1  [8])((long)&local_b8 + 4);
                uStack_1f0 = 1;
                local_1e8 = 3;
                local_1d8 = 1;
                uStack_1d0 = 0;
                local_1c8 = 4;
                local_240.m_matrix = (non_const_type)&local_238;
                uStack_1e0 = (float *)&local_b8;
                Eigen::internal::
                check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                          ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                           &local_240);
                if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
                  lVar2 = 0;
                  do {
                    *(float *)local_1f8 =
                         *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *
                                            )&(local_240.m_matrix)->
                                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                           )->m_storage).m_data.array + lVar2 * 4);
                    lVar2 = lVar2 + 1;
                    local_1f8 = (undefined1  [8])((long)local_1f8 + 0x10);
                  } while (lVar2 != 3);
                  local_1f8 = (undefined1  [8])&uStack_b0;
                  uStack_1f0 = 1;
                  local_1e8 = 3;
                  local_1d8 = 2;
                  uStack_1d0 = 0;
                  local_1c8 = 4;
                  local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array._0_8_ = &local_24c;
                  uStack_1e0 = (float *)&local_b8;
                  Eigen::internal::
                  check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_238);
                  if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
                    lVar2 = 0;
                    do {
                      *(float *)local_1f8 =
                           (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                            local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array._0_8_)->m_storage).m_data.array[lVar2];
                      lVar2 = lVar2 + 1;
                      local_1f8 = (undefined1  [8])((long)local_1f8 + 0x10);
                    } while (lVar2 != 3);
                    (__return_storage_ptr__->
                    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    (__return_storage_ptr__->
                    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (__return_storage_ptr__->
                    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    fStack_1c0 = local_c8[3] * (float)uStack_180 +
                                 local_c8[2] * (float)uStack_190 +
                                 local_c8[1] * (float)uStack_1a0 + local_c8[0] * (float)uStack_1b0;
                    fStack_1bc = local_c8[3] * uStack_180._4_4_ +
                                 local_c8[2] * uStack_190._4_4_ +
                                 local_c8[1] * uStack_1a0._4_4_ + local_c8[0] * uStack_1b0._4_4_;
                    local_1f8._4_4_ =
                         uStack_f0._4_4_ * local_188._4_4_ +
                         (float)uStack_f0 * local_198._4_4_ +
                         (float)local_f8._4_4_ * local_1a8._4_4_ +
                         (float)local_f8._0_4_ * fStack_1b4;
                    local_1f8._0_4_ =
                         uStack_f0._4_4_ * (float)local_188 +
                         (float)uStack_f0 * (float)local_198 +
                         (float)local_f8._4_4_ * (float)local_1a8 +
                         (float)local_f8._0_4_ * (float)local_1b8;
                    uStack_1f0._4_4_ =
                         uStack_f0._4_4_ * uStack_180._4_4_ +
                         (float)uStack_f0 * uStack_190._4_4_ +
                         (float)local_f8._4_4_ * uStack_1a0._4_4_ +
                         (float)local_f8._0_4_ * uStack_1b0._4_4_;
                    uStack_1f0._0_4_ =
                         uStack_f0._4_4_ * (float)uStack_180 +
                         (float)uStack_f0 * (float)uStack_190 +
                         (float)local_f8._4_4_ * (float)uStack_1a0 +
                         (float)local_f8._0_4_ * (float)uStack_1b0;
                    local_1e8._4_4_ =
                         uStack_e0._4_4_ * local_188._4_4_ +
                         (float)uStack_e0 * local_198._4_4_ +
                         local_e8._4_4_ * local_1a8._4_4_ + (float)local_e8 * fStack_1b4;
                    local_1e8._0_4_ =
                         uStack_e0._4_4_ * (float)local_188 +
                         (float)uStack_e0 * (float)local_198 +
                         local_e8._4_4_ * (float)local_1a8 + (float)local_e8 * (float)local_1b8;
                    uStack_1e0 = (float *)CONCAT44(uStack_e0._4_4_ * uStack_180._4_4_ +
                                                   (float)uStack_e0 * uStack_190._4_4_ +
                                                   local_e8._4_4_ * uStack_1a0._4_4_ +
                                                   (float)local_e8 * uStack_1b0._4_4_,
                                                   uStack_e0._4_4_ * (float)uStack_180 +
                                                   (float)uStack_e0 * (float)uStack_190 +
                                                   local_e8._4_4_ * (float)uStack_1a0 +
                                                   (float)local_e8 * (float)uStack_1b0);
                    local_1d8._4_4_ =
                         uStack_d0._4_4_ * local_188._4_4_ +
                         (float)uStack_d0 * local_198._4_4_ +
                         local_d8._4_4_ * local_1a8._4_4_ + (float)local_d8 * fStack_1b4;
                    local_1d8._0_4_ =
                         uStack_d0._4_4_ * (float)local_188 +
                         (float)uStack_d0 * (float)local_198 +
                         local_d8._4_4_ * (float)local_1a8 + (float)local_d8 * (float)local_1b8;
                    uStack_1d0._4_4_ =
                         uStack_d0._4_4_ * uStack_180._4_4_ +
                         (float)uStack_d0 * uStack_190._4_4_ +
                         local_d8._4_4_ * uStack_1a0._4_4_ + (float)local_d8 * uStack_1b0._4_4_;
                    uStack_1d0._0_4_ =
                         uStack_d0._4_4_ * (float)uStack_180 +
                         (float)uStack_d0 * (float)uStack_190 +
                         local_d8._4_4_ * (float)uStack_1a0 + (float)local_d8 * (float)uStack_1b0;
                    local_1c8 = CONCAT44(local_c8[3] * local_188._4_4_ +
                                         local_c8[2] * local_198._4_4_ +
                                         local_c8[1] * local_1a8._4_4_ + local_c8[0] * fStack_1b4,
                                         local_c8[3] * (float)local_188 +
                                         local_c8[2] * (float)local_198 +
                                         local_c8[1] * (float)local_1a8 +
                                         local_c8[0] * (float)local_1b8);
                    iVar1._M_current =
                         (__return_storage_ptr__->
                         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    if (iVar1._M_current ==
                        (__return_storage_ptr__->
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                                ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                  *)__return_storage_ptr__,iVar1,
                                 (Matrix<float,_4,_4,_0,_4,_4> *)local_1f8);
                    }
                    else {
                      *(Index *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 0xc) = local_1c8;
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 0xe) = CONCAT44(fStack_1bc,fStack_1c0);
                      *(long *)(((iVar1._M_current)->
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                m_storage.m_data.array + 8) = local_1d8;
                      *(long *)(((iVar1._M_current)->
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                m_storage.m_data.array + 10) = uStack_1d0;
                      *(long *)(((iVar1._M_current)->
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                m_storage.m_data.array + 4) = local_1e8;
                      *(float **)
                       (((iVar1._M_current)->
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                        m_data.array + 6) = uStack_1e0;
                      *(undefined1 (*) [8])
                       ((iVar1._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array = local_1f8;
                      *(long *)(((iVar1._M_current)->
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                m_storage.m_data.array + 2) = uStack_1f0;
                      (__return_storage_ptr__->
                      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                    }
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[2] =
                         local_138[3] * (float)uStack_80 +
                         local_138[2] * (float)uStack_90 +
                         local_138[1] * (float)uStack_a0 + local_138[0] * (float)uStack_b0;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[3] =
                         local_138[3] * uStack_80._4_4_ +
                         local_138[2] * uStack_90._4_4_ +
                         local_138[1] * uStack_a0._4_4_ + local_138[0] * uStack_b0._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[4] =
                         local_138[7] * (float)local_88 +
                         local_138[6] * (float)local_98 +
                         local_138[5] * (float)local_a8 + local_138[4] * (float)local_b8;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[5] =
                         local_138[7] * local_88._4_4_ +
                         local_138[6] * local_98._4_4_ +
                         local_138[5] * local_a8._4_4_ + local_138[4] * local_b8._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[6] =
                         local_138[7] * (float)uStack_80 +
                         local_138[6] * (float)uStack_90 +
                         local_138[5] * (float)uStack_a0 + local_138[4] * (float)uStack_b0;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[7] =
                         local_138[7] * uStack_80._4_4_ +
                         local_138[6] * uStack_90._4_4_ +
                         local_138[5] * uStack_a0._4_4_ + local_138[4] * uStack_b0._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[8] =
                         local_138[0xb] * (float)local_88 +
                         local_138[10] * (float)local_98 +
                         local_138[9] * (float)local_a8 + local_138[8] * (float)local_b8;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[9] =
                         local_138[0xb] * local_88._4_4_ +
                         local_138[10] * local_98._4_4_ +
                         local_138[9] * local_a8._4_4_ + local_138[8] * local_b8._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[10] =
                         local_138[0xb] * (float)uStack_80 +
                         local_138[10] * (float)uStack_90 +
                         local_138[9] * (float)uStack_a0 + local_138[8] * (float)uStack_b0;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xb] =
                         local_138[0xb] * uStack_80._4_4_ +
                         local_138[10] * uStack_90._4_4_ +
                         local_138[9] * uStack_a0._4_4_ + local_138[8] * uStack_b0._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xc] =
                         local_138[0xf] * (float)local_88 +
                         local_138[0xe] * (float)local_98 +
                         local_138[0xd] * (float)local_a8 + local_138[0xc] * (float)local_b8;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd] =
                         local_138[0xf] * local_88._4_4_ +
                         local_138[0xe] * local_98._4_4_ +
                         local_138[0xd] * local_a8._4_4_ + local_138[0xc] * local_b8._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xe] =
                         local_138[0xf] * (float)uStack_80 +
                         local_138[0xe] * (float)uStack_90 +
                         local_138[0xd] * (float)uStack_a0 + local_138[0xc] * (float)uStack_b0;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xf] =
                         local_138[0xf] * uStack_80._4_4_ +
                         local_138[0xe] * uStack_90._4_4_ +
                         local_138[0xd] * uStack_a0._4_4_ + local_138[0xc] * uStack_b0._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[1] =
                         local_138[3] * local_88._4_4_ +
                         local_138[2] * local_98._4_4_ +
                         local_138[1] * local_a8._4_4_ + local_138[0] * local_b8._4_4_;
                    local_238.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0] =
                         local_138[3] * (float)local_88 +
                         local_138[2] * (float)local_98 +
                         local_138[1] * (float)local_a8 + local_138[0] * (float)local_b8;
                    iVar1._M_current =
                         (__return_storage_ptr__->
                         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    if (iVar1._M_current ==
                        (__return_storage_ptr__->
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                                ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                  *)__return_storage_ptr__,iVar1,&local_238);
                    }
                    else {
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 0xc) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[0xd],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[0xc]);
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 0xe) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[0xf],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[0xe]);
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 8) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[9],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[8]);
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 10) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[0xb],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[10]);
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 4) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[5],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[4]);
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 6) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[7],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[6]);
                      *(undefined8 *)
                       ((iVar1._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array = local_238.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array._0_8_;
                      *(ulong *)(((iVar1._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 2) =
                           CONCAT44(local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[3],
                                    local_238.
                                    super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array[2]);
                      (__return_storage_ptr__->
                      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                    }
                    return __return_storage_ptr__;
                  }
                }
              }
            }
          }
        }
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 4, 4>>]"
                     );
      }
LAB_0014f580:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 3, 1>]"
                   );
    }
  }
  local_160.m_value = 4;
  local_178.m_value = (long)uStack_b0;
  local_170 = pfVar4;
  local_168 = uStack_b0;
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1L1Q1P(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B,
	Matrix<floatPrec, 4,1> Pi, Matrix<floatPrec, 4,1> Pi_B)
{

	// project points P1 and P1_B to planes Pi and Pi_B
	Matrix<floatPrec, 4,1> P1_pi, P1_pi_B;
	P1_pi.head(3) = P1.head(3) - (P1.head(3).dot(Pi.head(3)) + Pi(3)) * Pi.head(3);
	P1_pi(3) = 1.0;
	P1_pi_B.head(3) = P1_B.head(3) - (P1_B.head(3).dot(Pi_B.head(3)) + Pi_B(3)) * Pi_B.head(3);
	P1_pi_B(3) = 1.0;

	// translate frames to P1_pi and P1_pi_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1_pi.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_pi_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> Pi_1, Pi_B1;
	Pi_1 = transU.transpose().inverse() * Pi;
	Pi_B1 = transU_B.transpose().inverse() * Pi_B;

	// aling planes Pi and Pi_B with XY planes of both frames
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = Pi_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = Pi_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}